

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window.c
# Opt level: O0

void glfwSetWindowMonitor
               (GLFWwindow *wh,GLFWmonitor *mh,int xpos,int ypos,int width,int height,
               int refreshRate)

{
  undefined8 in_RSI;
  _GLFWmonitor *in_RDI;
  uint in_R8D;
  uint in_R9D;
  _GLFWmonitor *monitor;
  _GLFWwindow *window;
  int in_stack_ffffffffffffffcc;
  
  if (_glfw.initialized == 0) {
    _glfwInputError(0x10001,(char *)0x0);
  }
  else if (((int)in_R8D < 1) || ((int)in_R9D < 1)) {
    _glfwInputError(0x10004,"Invalid window size %ix%i",(ulong)in_R8D,(ulong)in_R9D);
  }
  else if (((int)(uint)monitor < 0) && ((uint)monitor != 0xffffffff)) {
    _glfwInputError(0x10004,"Invalid refresh rate %i",(ulong)(uint)monitor);
  }
  else {
    *(uint *)(in_RDI->name + 0x2c) = in_R8D;
    *(uint *)(in_RDI->name + 0x30) = in_R9D;
    *(uint *)(in_RDI->name + 0x40) = (uint)monitor;
    _glfwPlatformSetWindowMonitor
              ((_GLFWwindow *)CONCAT44(in_R8D,in_R9D),in_RDI,(int)((ulong)in_RSI >> 0x20),
               (int)in_RSI,in_stack_ffffffffffffffcc,(uint)monitor,(int)in_RSI);
  }
  return;
}

Assistant:

GLFWAPI void glfwSetWindowMonitor(GLFWwindow* wh,
                                  GLFWmonitor* mh,
                                  int xpos, int ypos,
                                  int width, int height,
                                  int refreshRate)
{
    _GLFWwindow* window = (_GLFWwindow*) wh;
    _GLFWmonitor* monitor = (_GLFWmonitor*) mh;
    assert(window != NULL);
    assert(width >= 0);
    assert(height >= 0);

    _GLFW_REQUIRE_INIT();

    if (width <= 0 || height <= 0)
    {
        _glfwInputError(GLFW_INVALID_VALUE,
                        "Invalid window size %ix%i",
                        width, height);
        return;
    }

    if (refreshRate < 0 && refreshRate != GLFW_DONT_CARE)
    {
        _glfwInputError(GLFW_INVALID_VALUE,
                        "Invalid refresh rate %i",
                        refreshRate);
        return;
    }

    window->videoMode.width       = width;
    window->videoMode.height      = height;
    window->videoMode.refreshRate = refreshRate;

    _glfwPlatformSetWindowMonitor(window, monitor,
                                  xpos, ypos, width, height,
                                  refreshRate);
}